

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::GetterXsYRef<long_long>,_ImPlot::TransformerLogLog>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::GetterXsYRef<long_long>,_ImPlot::TransformerLogLog>
                 *this,GetterXsYs<long_long> *getter1,GetterXsYRef<long_long> *getter2,
                TransformerLogLog *transformer,ImU32 col)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  long lVar6;
  ImPlotPlot *pIVar7;
  GetterXsYRef<long_long> *pGVar8;
  TransformerLogLog *pTVar9;
  ImVec2 IVar10;
  ImVec2 IVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  ImPlotContext *pIVar15;
  int iVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar5 = getter1->Count;
  iVar16 = getter2->Count;
  if (iVar5 < getter2->Count) {
    iVar16 = iVar5;
  }
  this->Prims = iVar16 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar15 = GImPlot;
  (this->P12).y = 0.0;
  lVar17 = (long)((getter1->Offset % iVar5 + iVar5) % iVar5) * (long)getter1->Stride;
  lVar6 = *(long *)((long)getter1->Ys + lVar17);
  dVar12 = log10((double)*(long *)((long)getter1->Xs + lVar17) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar7 = pIVar15->CurrentPlot;
  dVar1 = pIVar15->LogDenX;
  dVar2 = (pIVar7->XAxis).Range.Min;
  dVar3 = (pIVar7->XAxis).Range.Max;
  dVar13 = log10((double)lVar6 / pIVar7->YAxis[transformer->YAxis].Range.Min);
  iVar5 = transformer->YAxis;
  pIVar7 = pIVar15->CurrentPlot;
  auVar18._8_8_ = dVar13;
  auVar18._0_8_ = dVar12;
  auVar19._8_8_ = pIVar15->LogDenY[iVar5];
  auVar19._0_8_ = dVar1;
  auVar19 = divpd(auVar18,auVar19);
  dVar1 = pIVar7->YAxis[iVar5].Range.Min;
  IVar4 = pIVar15->PixelRange[iVar5].Min;
  IVar10.y = (float)(pIVar15->My[iVar5] *
                     (((double)(float)auVar19._8_8_ * (pIVar7->YAxis[iVar5].Range.Max - dVar1) +
                      dVar1) - dVar1) + (double)IVar4.y);
  IVar10.x = (float)(pIVar15->Mx *
                     (((double)(float)auVar19._0_8_ * (dVar3 - dVar2) + dVar2) -
                     (pIVar7->XAxis).Range.Min) + (double)IVar4.x);
  this->P11 = IVar10;
  pIVar15 = GImPlot;
  pGVar8 = this->Getter2;
  pTVar9 = this->Transformer;
  iVar5 = pGVar8->Count;
  dVar1 = pGVar8->YRef;
  dVar13 = log10((double)*(long *)((long)pGVar8->Xs +
                                  (long)((pGVar8->Offset % iVar5 + iVar5) % iVar5) *
                                  (long)pGVar8->Stride) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar7 = pIVar15->CurrentPlot;
  dVar2 = pIVar15->LogDenX;
  dVar3 = (pIVar7->XAxis).Range.Min;
  dVar12 = (pIVar7->XAxis).Range.Max;
  dVar1 = log10(dVar1 / pIVar7->YAxis[pTVar9->YAxis].Range.Min);
  iVar5 = pTVar9->YAxis;
  pIVar7 = pIVar15->CurrentPlot;
  auVar20._8_8_ = dVar1;
  auVar20._0_8_ = dVar13;
  auVar14._8_8_ = pIVar15->LogDenY[iVar5];
  auVar14._0_8_ = dVar2;
  auVar19 = divpd(auVar20,auVar14);
  dVar1 = pIVar7->YAxis[iVar5].Range.Min;
  IVar4 = pIVar15->PixelRange[iVar5].Min;
  IVar11.y = (float)(pIVar15->My[iVar5] *
                     (((double)(float)auVar19._8_8_ * (pIVar7->YAxis[iVar5].Range.Max - dVar1) +
                      dVar1) - dVar1) + (double)IVar4.y);
  IVar11.x = (float)(pIVar15->Mx *
                     (((double)(float)auVar19._0_8_ * (dVar12 - dVar3) + dVar3) -
                     (pIVar7->XAxis).Range.Min) + (double)IVar4.x);
  this->P12 = IVar11;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }